

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ditFrameworkTests.cpp
# Opt level: O1

void __thiscall
dit::(anonymous_namespace)::ConstantInterpolationTest::runCase(dit::(anonymous_namespace)::
ConstantInterpolationTest::SubCase_const&)::FragShader::shadeFragments(rr::FragmentPacket*,int,rr::
FragmentShadingContext_const___const
          (void *this,FragmentPacket *packets,int numPackets,FragmentShadingContext *context)

{
  GenericVec4 *pGVar1;
  int iVar2;
  ulong uVar3;
  FragmentPacket *packet;
  int fragNdx;
  int fragNdx_00;
  int iVar4;
  Vec4 interp;
  deUint32 local_50;
  deUint32 local_4c;
  deUint32 local_48;
  deUint32 local_44;
  ulong local_40;
  FragmentPacket *local_38;
  
  if (0 < numPackets) {
    local_40 = (ulong)(uint)numPackets;
    iVar4 = 0;
    uVar3 = 0;
    local_38 = packets;
    do {
      packet = local_38 + uVar3;
      fragNdx_00 = 0;
      do {
        rr::readTriangleVarying<float>((rr *)&local_50,packet,context,0,fragNdx_00);
        pGVar1 = context->outputArray;
        iVar2 = (iVar4 + fragNdx_00) * context->numFragmentOutputs;
        pGVar1[iVar2].v.uData[0] = local_50;
        pGVar1[iVar2].v.uData[1] = local_4c;
        pGVar1[iVar2].v.uData[2] = local_48;
        pGVar1[iVar2].v.uData[3] = local_44;
        fragNdx_00 = fragNdx_00 + 1;
      } while (fragNdx_00 != 4);
      uVar3 = uVar3 + 1;
      iVar4 = iVar4 + 4;
    } while (uVar3 != local_40);
  }
  return;
}

Assistant:

void shadeFragments (rr::FragmentPacket* packets, const int numPackets, const rr::FragmentShadingContext& context) const
				{
					for (int packetNdx = 0; packetNdx < numPackets; packetNdx++)
					{
						for (int fragNdx = 0; fragNdx < rr::NUM_FRAGMENTS_PER_PACKET; fragNdx++)
						{
							const tcu::Vec4 interp = rr::readTriangleVarying<float>(packets[packetNdx], context, 0, fragNdx);
							rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, interp);
						}
					}
				}